

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

int __thiscall deqp::ShaderRenderCase::init(ShaderRenderCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  char *pcVar4;
  TestError *this_01;
  exception *anon_var_0;
  string local_148;
  allocator<char> local_111;
  string local_110;
  ProgramSources local_f0;
  long local_20;
  Functions *gl;
  TestLog *log;
  ShaderRenderCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar2);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"ShaderRenderCase::init() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1b1);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  anon_var_0._6_1_ = 1;
  renderCtx = this->m_renderCtx;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar4,&local_111);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,pcVar4,(allocator<char> *)((long)&anon_var_0 + 7));
  glu::makeVtxFragSources(&local_f0,&local_110,&local_148);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f0);
  anon_var_0._6_1_ = 0;
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  glu::operator<<((TestLog *)gl,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
               ,0x1bc);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"ShaderRenderCase::init() end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1be);
  return extraout_EAX;
}

Assistant:

void ShaderRenderCase::init(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::init() begin");

	DE_ASSERT(!m_program);
	m_program =
		new ShaderProgram(m_renderCtx, glu::makeVtxFragSources(m_vertShaderSource.c_str(), m_fragShaderSource.c_str()));

	try
	{
		log << *m_program; // Always log shader program.

		if (!m_program->isOk())
			TCU_FAIL("Failed to compile shader program");

		GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::init() end");
	}
	catch (const std::exception&)
	{
		// Clean up.
		ShaderRenderCase::deinit();
		throw;
	}
}